

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_COORD.cpp
# Opt level: O3

void __thiscall PP_COORD::show(PP_COORD *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(x,y,z)=(",9);
  poVar1 = std::ostream::_M_insert<double>(this->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(this->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(this->z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void PP_COORD::show(void)
{
    std::cout << "(x,y,z)=(" << x << "," << y << "," << z << ")" << std::endl;
}